

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::ColorSetChanged(DPlayerMenu *this,FListMenuItem *li)

{
  uint uVar1;
  uint *puVar2;
  FListMenuItem *pFVar3;
  char local_68 [8];
  char command [24];
  FListMenuItem *blue;
  FListMenuItem *local_38;
  FListMenuItem *green;
  FListMenuItem *local_28;
  FListMenuItem *red;
  int mycolorset;
  int sel;
  FListMenuItem *li_local;
  DPlayerMenu *this_local;
  
  _mycolorset = li;
  li_local = (FListMenuItem *)this;
  uVar1 = (*li->_vptr_FListMenuItem[0xb])(li,0,(long)&red + 4);
  if ((uVar1 & 1) != 0) {
    red._0_4_ = 0xffffffff;
    if (0 < red._4_4_) {
      puVar2 = (uint *)TArray<int,_int>::operator[](&this->PlayerColorSets,(long)(red._4_4_ + -1));
      red._0_4_ = *puVar2;
    }
    FName::FName((FName *)((long)&green + 4),NAME_Red);
    local_28 = DListMenu::GetItem(&this->super_DListMenu,(FName *)((long)&green + 4));
    FName::FName((FName *)((long)&blue + 4),NAME_Green);
    local_38 = DListMenu::GetItem(&this->super_DListMenu,(FName *)((long)&blue + 4));
    FName::FName((FName *)(command + 0x14),NAME_Blue);
    pFVar3 = DListMenu::GetItem(&this->super_DListMenu,(FName *)(command + 0x14));
    if (local_28 != (FListMenuItem *)0x0) {
      (*local_28->_vptr_FListMenuItem[0xc])(local_28,(ulong)((uint)red == 0xffffffff));
    }
    if (local_38 != (FListMenuItem *)0x0) {
      (*local_38->_vptr_FListMenuItem[0xc])(local_38,(ulong)((uint)red == 0xffffffff));
    }
    if (pFVar3 != (FListMenuItem *)0x0) {
      (*pFVar3->_vptr_FListMenuItem[0xc])(pFVar3,(ulong)((uint)red == 0xffffffff));
    }
    userinfo_t::ColorSetChanged((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8),(uint)red);
    mysnprintf(local_68,0x18,"colorset %d",(ulong)(uint)red);
    C_DoCommand(local_68,0);
    UpdateTranslation(this);
  }
  return;
}

Assistant:

void DPlayerMenu::ColorSetChanged (FListMenuItem *li)
{
	int	sel;

	if (li->GetValue(0, &sel))
	{
		int mycolorset = -1;

		if (sel > 0) mycolorset = PlayerColorSets[sel-1];

		FListMenuItem *red   = GetItem(NAME_Red);
		FListMenuItem *green = GetItem(NAME_Green);
		FListMenuItem *blue  = GetItem(NAME_Blue);

		// disable the sliders if a valid colorset is selected
		if (red != NULL) red->Enable(mycolorset == -1);
		if (green != NULL) green->Enable(mycolorset == -1);
		if (blue != NULL) blue->Enable(mycolorset == -1);

		char command[24];
		players[consoleplayer].userinfo.ColorSetChanged(mycolorset);
		mysnprintf(command, countof(command), "colorset %d", mycolorset);
		C_DoCommand(command);
		UpdateTranslation();
	}
}